

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor.c
# Opt level: O2

cn_cbor * cn_cbor_null_create(cn_cbor_errback *errp)

{
  cn_cbor *pcVar1;
  
  pcVar1 = (cn_cbor *)calloc(1,0x38);
  if (pcVar1 == (cn_cbor *)0x0) {
    if (errp != (cn_cbor_errback *)0x0) {
      errp->err = CN_CBOR_ERR_OUT_OF_MEMORY;
    }
  }
  else {
    pcVar1->type = CN_CBOR_NULL;
  }
  return pcVar1;
}

Assistant:

cn_cbor * cn_cbor_null_create(CBOR_CONTEXT_COMMA cn_cbor_errback * errp)
{
	cn_cbor * pcn = CN_CALLOC(context);
	if (pcn == NULL) {
		if (errp != NULL) errp->err = CN_CBOR_ERR_OUT_OF_MEMORY;
		return NULL;
	}
	pcn->type = CN_CBOR_NULL;
	return pcn;
}